

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

WaitOrderStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WaitOrderStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>&,slang::parsing::Token,slang::syntax::ActionBlockSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *args_4,Token *args_5,
          ActionBlockSyntax *args_6)

{
  Token wait_order;
  Token openParen;
  Token closeParen;
  WaitOrderStatementSyntax *this_00;
  
  this_00 = (WaitOrderStatementSyntax *)allocate(this,200,8);
  wait_order.kind = args_2->kind;
  wait_order._2_1_ = args_2->field_0x2;
  wait_order.numFlags.raw = (args_2->numFlags).raw;
  wait_order.rawLen = args_2->rawLen;
  wait_order.info = args_2->info;
  closeParen.kind = args_5->kind;
  closeParen._2_1_ = args_5->field_0x2;
  closeParen.numFlags.raw = (args_5->numFlags).raw;
  closeParen.rawLen = args_5->rawLen;
  closeParen.info = args_5->info;
  openParen.kind = args_3->kind;
  openParen._2_1_ = args_3->field_0x2;
  openParen.numFlags.raw = (args_3->numFlags).raw;
  openParen.rawLen = args_3->rawLen;
  openParen.info = args_3->info;
  slang::syntax::WaitOrderStatementSyntax::WaitOrderStatementSyntax
            (this_00,*args,args_1,wait_order,openParen,args_4,closeParen,args_6);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }